

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_color.cpp
# Opt level: O3

void __thiscall Prog::draw_swatch(Prog *this,float x1,float y1,float x2,float y2,float *v)

{
  ALLEGRO_FONT *pAVar1;
  undefined8 uVar2;
  Theme *pTVar3;
  undefined4 uVar4;
  float fVar5;
  char html [8];
  undefined1 local_28 [8];
  
  fVar5 = v[1];
  uVar4 = al_map_rgb_f(*v,fVar5,v[2]);
  al_draw_filled_rectangle(x1,y1,x2,y2,uVar4,fVar5);
  uVar2 = al_color_rgb_to_name(*v,v[1],v[2]);
  al_color_rgb_to_html(*v,v[1],v[2],local_28);
  pTVar3 = Dialog::get_theme(&this->d);
  pAVar1 = pTVar3->font;
  al_map_rgb(0,0,0);
  al_draw_text(pAVar1,0,uVar2);
  pTVar3 = Dialog::get_theme(&this->d);
  pAVar1 = pTVar3->font;
  al_map_rgb(0,0,0);
  al_draw_text(pAVar1,0,local_28);
  return;
}

Assistant:

void Prog::draw_swatch(float x1, float y1, float x2, float y2, float v[3])
{
   al_draw_filled_rectangle(x1, y1, x2, y2, al_map_rgb_f(v[0], v[1], v[2]));

   char const *name = al_color_rgb_to_name(v[0], v[1], v[2]);
   char html[8];
   al_color_rgb_to_html(v[0], v[1], v[2], html);
   al_draw_text(d.get_theme().font, al_map_rgb(0, 0, 0), x1, y1 - 20, 0, name);
   al_draw_text(d.get_theme().font, al_map_rgb(0, 0, 0), x1, y1 - 40, 0, html);
}